

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O1

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContBind
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ContBind *curr,
          optional<wasm::HeapType> src,optional<wasm::HeapType> dest)

{
  Expression **ppEVar1;
  size_t sVar2;
  size_t sVar3;
  Type *pTVar4;
  ulong uVar5;
  long lVar6;
  Signature SVar7;
  Type local_78;
  Type targetParams;
  Type local_60;
  Type sourceParams;
  _Storage<wasm::HeapType,_true> local_50;
  char local_48;
  _Storage<wasm::HeapType,_true> local_40;
  char local_38;
  
  local_40 = dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  local_50 = src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  local_48 = src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_engaged;
  local_38 = dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_engaged;
  sourceParams.id = (uintptr_t)this;
  if (((undefined1  [16])
       src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    local_50._M_value = wasm::Type::getHeapType(&curr->cont->type);
    if (local_48 == '\0') {
      local_48 = '\x01';
    }
  }
  if (local_38 == '\0') {
    local_40._M_value =
         wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)91>).super_Expression.
                     type);
    if (local_38 == '\0') {
      local_38 = '\x01';
    }
  }
  targetParams.id = (uintptr_t)HeapType::getContinuation(&local_50._M_value);
  SVar7 = HeapType::getSignature((HeapType *)&targetParams);
  local_60 = SVar7.params.id;
  targetParams.id = (uintptr_t)HeapType::getContinuation(&local_40._M_value);
  SVar7 = HeapType::getSignature((HeapType *)&targetParams);
  local_78 = SVar7.params.id;
  sVar2 = wasm::Type::size(&local_60);
  sVar3 = wasm::Type::size(&local_78);
  if (sVar2 < sVar3) {
    __assert_fail("sourceParams.size() >= targetParams.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x459,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContBind(ContBind *, std::optional<HeapType>, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  sVar2 = wasm::Type::size(&local_60);
  sVar3 = wasm::Type::size(&local_78);
  if ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements != sVar2 - sVar3) {
    __assert_fail("curr->operands.size() == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x45b,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContBind(ContBind *, std::optional<HeapType>, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  if (sVar2 != sVar3) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar5) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      ppEVar1 = (curr->operands).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      targetParams.id = (uintptr_t)&local_60;
      pTVar4 = wasm::Type::Iterator::operator*((Iterator *)&targetParams);
      IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
                ((ConstraintCollector *)sourceParams.id,(Expression **)((long)ppEVar1 + lVar6),
                 (Type)pTVar4->id);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 8;
    } while (sVar2 - sVar3 != uVar5);
  }
  if (((uint)(0x7c < (ulong)local_50) * 4 + 3 & local_50._0_4_) == 0) {
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)sourceParams.id,&curr->cont,(Type)((ulong)local_50 | 2));
    return;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

void visitContBind(ContBind* curr,
                     std::optional<HeapType> src = std::nullopt,
                     std::optional<HeapType> dest = std::nullopt) {
    if (!src.has_value()) {
      src = curr->cont->type.getHeapType();
    }
    if (!dest.has_value()) {
      dest = curr->type.getHeapType();
    }
    auto sourceParams = src->getContinuation().type.getSignature().params;
    auto targetParams = dest->getContinuation().type.getSignature().params;
    assert(sourceParams.size() >= targetParams.size());
    auto n = sourceParams.size() - targetParams.size();
    assert(curr->operands.size() == n);
    for (size_t i = 0; i < n; ++i) {
      note(&curr->operands[i], sourceParams[i]);
    }
    note(&curr->cont, Type(*src, Nullable));
  }